

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

void __thiscall
agge::tests::LayoutTests::LongWordsAreEmergentlyBrokenOnWidthLimit(LayoutTests *this)

{
  wrap limiter;
  wrap limiter_00;
  element_type *peVar1;
  glyph *local_980;
  allocator local_921;
  string local_920;
  LocationInfo local_900;
  text_line *local_8d8;
  text_line *local_8d0;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_8c8;
  int local_8ac;
  vector<int,_std::allocator<int>_> local_8a8;
  undefined1 local_890 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_848;
  ref_text_line local_830;
  int local_808 [4];
  vector<int,_std::allocator<int>_> local_7f8;
  vector<int,_std::allocator<int>_> local_7e0;
  vector<int,_std::allocator<int>_> local_7c8;
  vector<int,_std::allocator<int>_> local_7b0;
  undefined1 local_798 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_750;
  ref_text_line local_738;
  int local_710 [4];
  vector<int,_std::allocator<int>_> local_700;
  vector<int,_std::allocator<int>_> local_6e8;
  vector<int,_std::allocator<int>_> local_6d0;
  vector<int,_std::allocator<int>_> local_6b8;
  undefined1 local_6a0 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_658;
  ref_text_line local_640;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_618;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_600;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_5e8;
  wrap local_5d0;
  allocator local_5b1;
  string local_5b0;
  richtext_t local_590;
  allocator local_521;
  string local_520;
  LocationInfo local_500;
  text_line *local_4d8;
  text_line *local_4d0;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_4c8;
  int local_4ac [3];
  vector<int,_std::allocator<int>_> local_4a0;
  vector<int,_std::allocator<int>_> local_488;
  vector<int,_std::allocator<int>_> local_470;
  undefined1 local_458 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_410;
  ref_text_line local_3f8;
  int local_3cc [3];
  vector<int,_std::allocator<int>_> local_3c0;
  vector<int,_std::allocator<int>_> local_3a8;
  vector<int,_std::allocator<int>_> local_390;
  undefined1 local_378 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_330;
  ref_text_line local_318;
  int local_2ec [3];
  vector<int,_std::allocator<int>_> local_2e0;
  vector<int,_std::allocator<int>_> local_2c8;
  vector<int,_std::allocator<int>_> local_2b0;
  undefined1 local_298 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_250;
  ref_text_line local_238;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_210;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_1f8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_1e0;
  wrap local_1c8;
  allocator local_1a9;
  string local_1a8;
  richtext_t local_188;
  undefined1 local_120 [8];
  layout l;
  const_iterator gr;
  undefined1 local_b8 [8];
  factory_ptr f;
  glyph glyphs [3];
  undefined1 auStack_28 [8];
  char_to_index indices [3];
  LayoutTests *this_local;
  
  indices[1].symbol = 0x43;
  indices[1].index = 2;
  auStack_28 = (undefined1  [8])0x41;
  indices[0].symbol = 0x42;
  indices[0].index = 1;
  f.super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
  glyphs[0].metrics.dx = 0.0;
  glyphs[0].metrics.dy = 0.0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indices[2] = (char_to_index)this;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[0].metrics.dy);
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4000000000000000;
  glyphs[1].metrics.dx = 0.0;
  glyphs[1].metrics.dy = 0.0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[1].metrics.dy);
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  glyphs[2].metrics.dx = 0.0;
  glyphs[2].metrics.dy = 0.0;
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[2].metrics.dy);
  create_single_font_factory<3ul,3ul>
            ((LayoutTests *)local_b8,(font_metrics *)this,
             (char_to_index (*) [3])(anonymous_namespace)::c_fm1,(glyph (*) [3])auStack_28);
  __gnu_cxx::
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  ::__normal_iterator((__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
                       *)&l._box);
  layout::layout((layout *)local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"ABCABCABC",&local_1a9);
  R(&local_188,&local_1a8);
  limit::wrap::wrap(&local_1c8,6.0);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_b8);
  limiter._eow.next = local_1c8._eow.next;
  limiter._sow.extent = local_1c8._sow.extent;
  limiter._limit = local_1c8._limit;
  limiter._eow.extent = local_1c8._eow.extent;
  limiter._sow.next = local_1c8._sow.next;
  limiter._previous_space = local_1c8._previous_space;
  limiter._21_3_ = local_1c8._21_3_;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            ((layout *)local_120,&local_188,limiter,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_b8);
  font_factory::operator*((font_factory *)local_298);
  local_2ec[2] = 0;
  plural_::operator+(&local_2e0,(plural_ *)&plural,local_2ec + 2);
  local_2ec[1] = 1;
  tests::operator+(&local_2c8,&local_2e0,local_2ec + 1);
  local_2ec[0] = 2;
  tests::operator+(&local_2b0,&local_2c8,local_2ec);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_298 + 0x10),(shared_ptr<agge::font> *)local_298,0.0,0.0,
             &local_2b0);
  plural_::operator+(&local_250,(plural_ *)&plural,(ref_glyph_run *)(local_298 + 0x10));
  ref_text_line::ref_text_line(&local_238,0.0,10.0,6.0,&local_250);
  plural_::operator+(&local_210,(plural_ *)&plural,&local_238);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_b8);
  font_factory::operator*((font_factory *)local_378);
  local_3cc[2] = 0;
  plural_::operator+(&local_3c0,(plural_ *)&plural,local_3cc + 2);
  local_3cc[1] = 1;
  tests::operator+(&local_3a8,&local_3c0,local_3cc + 1);
  local_3cc[0] = 2;
  tests::operator+(&local_390,&local_3a8,local_3cc);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_378 + 0x10),(shared_ptr<agge::font> *)local_378,0.0,0.0,
             &local_390);
  plural_::operator+(&local_330,(plural_ *)&plural,(ref_glyph_run *)(local_378 + 0x10));
  ref_text_line::ref_text_line(&local_318,0.0,24.0,6.0,&local_330);
  tests::operator+(&local_1f8,&local_210,&local_318);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_b8);
  font_factory::operator*((font_factory *)local_458);
  local_4ac[2] = 0;
  plural_::operator+(&local_4a0,(plural_ *)&plural,local_4ac + 2);
  local_4ac[1] = 1;
  tests::operator+(&local_488,&local_4a0,local_4ac + 1);
  local_4ac[0] = 2;
  tests::operator+(&local_470,&local_488,local_4ac);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_458 + 0x10),(shared_ptr<agge::font> *)local_458,0.0,0.0,
             &local_470);
  plural_::operator+(&local_410,(plural_ *)&plural,(ref_glyph_run *)(local_458 + 0x10));
  ref_text_line::ref_text_line(&local_3f8,0.0,38.0,6.0,&local_410);
  tests::operator+(&local_1e0,&local_1f8,&local_3f8);
  local_4d0 = (text_line *)layout::begin((layout *)local_120);
  local_4d8 = (text_line *)layout::end((layout *)local_120);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_4c8,(tests *)local_4d0,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_4d8,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_1c8._16_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_520,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_521);
  ut::LocationInfo::LocationInfo(&local_500,&local_520,0x19f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_1e0,&local_4c8,&local_500);
  ut::LocationInfo::~LocationInfo(&local_500);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_4c8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_1e0);
  ref_text_line::~ref_text_line(&local_3f8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_410);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_458 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_470);
  std::vector<int,_std::allocator<int>_>::~vector(&local_488);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4a0);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_458);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_1f8);
  ref_text_line::~ref_text_line(&local_318);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_330);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_378 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_390);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3c0);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_378);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_210);
  ref_text_line::~ref_text_line(&local_238);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_250);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_298 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_2b0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2c8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2e0);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b0,"ABCABCABC",&local_5b1);
  R(&local_590,&local_5b0);
  limit::wrap::wrap(&local_5d0,8.0);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_b8);
  limiter_00._eow.next = local_5d0._eow.next;
  limiter_00._sow.extent = local_5d0._sow.extent;
  limiter_00._limit = local_5d0._limit;
  limiter_00._eow.extent = local_5d0._eow.extent;
  limiter_00._sow.next = local_5d0._sow.next;
  limiter_00._previous_space = local_5d0._previous_space;
  limiter_00._21_3_ = local_5d0._21_3_;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            ((layout *)local_120,&local_590,limiter_00,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_590);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_b8);
  font_factory::operator*((font_factory *)local_6a0);
  local_710[3] = 0;
  plural_::operator+(&local_700,(plural_ *)&plural,local_710 + 3);
  local_710[2] = 1;
  tests::operator+(&local_6e8,&local_700,local_710 + 2);
  local_710[1] = 2;
  tests::operator+(&local_6d0,&local_6e8,local_710 + 1);
  local_710[0] = 0;
  tests::operator+(&local_6b8,&local_6d0,local_710);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_6a0 + 0x10),(shared_ptr<agge::font> *)local_6a0,0.0,0.0,
             &local_6b8);
  plural_::operator+(&local_658,(plural_ *)&plural,(ref_glyph_run *)(local_6a0 + 0x10));
  ref_text_line::ref_text_line(&local_640,0.0,10.0,7.0,&local_658);
  plural_::operator+(&local_618,(plural_ *)&plural,&local_640);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_b8);
  font_factory::operator*((font_factory *)local_798);
  local_808[3] = 1;
  plural_::operator+(&local_7f8,(plural_ *)&plural,local_808 + 3);
  local_808[2] = 2;
  tests::operator+(&local_7e0,&local_7f8,local_808 + 2);
  local_808[1] = 0;
  tests::operator+(&local_7c8,&local_7e0,local_808 + 1);
  local_808[0] = 1;
  tests::operator+(&local_7b0,&local_7c8,local_808);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_798 + 0x10),(shared_ptr<agge::font> *)local_798,0.0,0.0,
             &local_7b0);
  plural_::operator+(&local_750,(plural_ *)&plural,(ref_glyph_run *)(local_798 + 0x10));
  ref_text_line::ref_text_line(&local_738,0.0,24.0,8.0,&local_750);
  tests::operator+(&local_600,&local_618,&local_738);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_b8);
  font_factory::operator*((font_factory *)local_890);
  local_8ac = 2;
  plural_::operator+(&local_8a8,(plural_ *)&plural,&local_8ac);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_890 + 0x10),(shared_ptr<agge::font> *)local_890,0.0,0.0,
             &local_8a8);
  plural_::operator+(&local_848,(plural_ *)&plural,(ref_glyph_run *)(local_890 + 0x10));
  ref_text_line::ref_text_line(&local_830,0.0,38.0,3.0,&local_848);
  tests::operator+(&local_5e8,&local_600,&local_830);
  local_8d0 = (text_line *)layout::begin((layout *)local_120);
  local_8d8 = (text_line *)layout::end((layout *)local_120);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_8c8,(tests *)local_8d0,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_8d8,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_5d0._16_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_920,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_921);
  ut::LocationInfo::LocationInfo(&local_900,&local_920,0x1a9);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_5e8,&local_8c8,&local_900);
  ut::LocationInfo::~LocationInfo(&local_900);
  std::__cxx11::string::~string((string *)&local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_8c8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_5e8);
  ref_text_line::~ref_text_line(&local_830);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_848);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_890 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_8a8);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_890);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_600);
  ref_text_line::~ref_text_line(&local_738);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_750);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_798 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_7b0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_7c8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_7e0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_7f8);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_798);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_618);
  ref_text_line::~ref_text_line(&local_640);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_658);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_6a0 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_6b8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_6d0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_6e8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_700);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_6a0);
  layout::~layout((layout *)local_120);
  std::shared_ptr<agge::tests::LayoutTests::font_factory>::~shared_ptr
            ((shared_ptr<agge::tests::LayoutTests::font_factory> *)local_b8);
  local_980 = (glyph *)&glyphs[2].outline.
                        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_980 = local_980 + -1;
    mocks::font_accessor::glyph::~glyph(local_980);
  } while (local_980 !=
           (glyph *)&f.
                     super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  return;
}

Assistant:

test( LongWordsAreEmergentlyBrokenOnWidthLimit )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 0 }, { L'B', 1 }, { L'C', 2 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 1, 0 } },
					{ { 2, 0 } },
					{ { 3, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout::const_iterator gr;
				layout l;

				// ACT
				l.process(R("ABCABCABC"), limit::wrap(6.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 6.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 1 + 2))
					+ ref_text_line(0.0f, 24.0f, 6.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 1 + 2))
					+ ref_text_line(0.0f, 38.0f, 6.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 1 + 2)),
					mkvector(l.begin(), l.end()));

				// ACT
				l.process(R("ABCABCABC"), limit::wrap(8.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 7.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 1 + 2 + 0))
					+ ref_text_line(0.0f, 24.0f, 8.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 0 + 1))
					+ ref_text_line(0.0f, 38.0f, 3.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 2)),
					mkvector(l.begin(), l.end()));
			}